

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O2

Type * __thiscall
QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
::operator()(QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
             *this)

{
  int iVar1;
  anon_struct_240_1_898a9ca8 *paVar2;
  long in_FS_OFFSET;
  Object local_28 [8];
  QMutexLocker<QBasicMutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)QtGlobalStatic::
            ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
            ::guard._q_value.super___atomic_base<signed_char>._M_i < -1) {
    paVar2 = (anon_struct_240_1_898a9ca8 *)0x0;
  }
  else {
    if (QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>>
        ::instance()::holder == '\0') {
      iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>>
                                   ::instance()::holder);
      if (iVar1 != 0) {
        __cxa_atexit(QtGlobalStatic::
                     ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
                     ::~ApplicationHolder,
                     &QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>>
                      ::instance()::holder,&__dso_handle);
        __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>>
                             ::instance()::holder);
      }
    }
    if ((__atomic_base<signed_char>)
        QtGlobalStatic::
        ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
        ::guard._q_value.super___atomic_base<signed_char>._M_i != -1) {
      local_20.m_isLocked = true;
      local_20._9_7_ = 0xaaaaaaaaaaaaaa;
      local_20.m_mutex =
           &QtGlobalStatic::
            ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
            ::mutex;
      QBasicMutex::lock(&QtGlobalStatic::
                         ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
                         ::mutex);
      if ((__atomic_base<signed_char>)
          QtGlobalStatic::
          ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
          ::guard._q_value.super___atomic_base<signed_char>._M_i == '\0') {
        QHostInfoLookupManager::QHostInfoLookupManager
                  ((QHostInfoLookupManager *)
                   &QtGlobalStatic::
                    ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
                    ::storage);
        QObject::connect<void(QObject::*)(QObject*),void(&)()>
                  (local_28,QCoreApplication::self,(ContextType *)QObject::destroyed,
                   (_func_void *)0x0,(ConnectionType)QCoreApplication::self);
        QMetaObject::Connection::~Connection((Connection *)local_28);
        QtGlobalStatic::
        ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
        ::guard._q_value.super___atomic_base<signed_char>._M_i =
             (Type)(__atomic_base<signed_char>)0xff;
      }
      QMutexLocker<QBasicMutex>::~QMutexLocker(&local_20);
    }
    paVar2 = &QtGlobalStatic::
              ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
              ::storage;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (Type *)paVar2;
  }
  __stack_chk_fail();
}

Assistant:

Type *operator()()
    {
        if (isDestroyed())
            return nullptr;
        return instance();
    }